

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

int * reversePeerArray(int MySize,int MyRank,int PeerSize,int *forward_entry)

{
  int *__ptr;
  int *__ptr_00;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  int j;
  int *their_peers;
  int i;
  int *ReversePeers;
  int PeerCount;
  int local_3c;
  int local_2c;
  int in_stack_ffffffffffffffe0;
  int MySize_00;
  
  MySize_00 = 0;
  __ptr = (int *)malloc(4);
  *in_RCX = -1;
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    __ptr_00 = PeerArray(MySize_00,in_stack_ffffffffffffffe0,(int)((ulong)__ptr >> 0x20));
    for (local_3c = 0; __ptr_00[local_3c] != -1; local_3c = local_3c + 1) {
      if (__ptr_00[local_3c] == in_ESI) {
        __ptr = (int *)realloc(__ptr,(long)(MySize_00 + 2) << 2);
        __ptr[MySize_00] = local_2c;
        MySize_00 = MySize_00 + 1;
        if (local_3c == 0) {
          *in_RCX = local_2c;
        }
      }
    }
    free(__ptr_00);
  }
  __ptr[MySize_00] = -1;
  return __ptr;
}

Assistant:

static int *reversePeerArray(int MySize, int MyRank, int PeerSize, int *forward_entry)
{
    int PeerCount = 0;
    int *ReversePeers = malloc(sizeof(int));

    *forward_entry = -1;
    for (int i = 0; i < PeerSize; i++)
    {
        int *their_peers = PeerArray(PeerSize, i, MySize);
        int j;
        j = 0;
        while (their_peers[j] != -1)
        {
            if (their_peers[j] == MyRank)
            {
                ReversePeers = realloc(ReversePeers, (PeerCount + 2) * sizeof(int));
                ReversePeers[PeerCount] = i;
                PeerCount++;
                if (j == 0)
                    *forward_entry = i;
            }
            j++;
        }
        free(their_peers);
    }
    ReversePeers[PeerCount] = -1;
    return ReversePeers;
}